

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumValueDescriptorProto::MergePartialFromCodedStream
          (EnumValueDescriptorProto *this,CodedInputStream *input)

{
  uint8 uVar1;
  bool bVar2;
  uint uVar3;
  Limit limit;
  undefined8 in_RAX;
  string *value;
  uint8 *puVar4;
  EnumValueOptions *this_00;
  uint uVar5;
  uint8 *puVar6;
  int iVar7;
  uint32 tag;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_001ea663:
  do {
    while( true ) {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (tag = (uint32)(char)*puVar6, -1 < (char)*puVar6)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar6 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar5 = tag >> 3;
      uVar3 = tag & 7;
      if (uVar5 != 3) break;
      if (uVar3 != 2) goto LAB_001ea766;
      uVar3 = this->_has_bits_[0];
LAB_001ea7d6:
      this->_has_bits_[0] = uVar3 | 4;
      this_00 = this->options_;
      if (this_00 == (EnumValueOptions *)0x0) {
        this_00 = (EnumValueOptions *)operator_new(0x60);
        EnumValueOptions::EnumValueOptions(this_00);
        this->options_ = this_00;
      }
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (-1 < (char)*puVar6)) {
        local_38 = CONCAT44(local_38._4_4_,(int)(char)*puVar6);
        input->buffer_ = puVar6 + 1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_38);
        if (!bVar2) {
          return false;
        }
      }
      iVar7 = input->recursion_depth_;
      input->recursion_depth_ = iVar7 + 1;
      if (input->recursion_limit_ <= iVar7) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,(uint32)local_38);
      bVar2 = EnumValueOptions::MergePartialFromCodedStream(this_00,input);
      if (!bVar2) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if (uVar5 == 2) {
      if (uVar3 == 0) {
        puVar4 = input->buffer_;
        puVar6 = input->buffer_end_;
        goto LAB_001ea74c;
      }
    }
    else if ((uVar5 == 1) && (uVar3 == 2)) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      value = this->name_;
      if (value == (string *)internal::kEmptyString_abi_cxx11_) {
        value = (string *)operator_new(0x20);
        (value->_M_dataplus)._M_p = (pointer)&value->field_2;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        this->name_ = value;
      }
      bVar2 = internal::WireFormatLite::ReadString(input,value);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
      puVar4 = input->buffer_;
      puVar6 = input->buffer_end_;
      if ((puVar4 < puVar6) && (*puVar4 == '\x10')) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
LAB_001ea74c:
        if ((puVar4 < puVar6) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
          puVar4 = puVar4 + 1;
          input->buffer_ = puVar4;
          iVar7 = (int)(char)uVar1;
        }
        else {
          bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&local_38 + 4));
          if (!bVar2) {
            return false;
          }
          puVar4 = input->buffer_;
          puVar6 = input->buffer_end_;
          iVar7 = local_38._4_4_;
        }
        this->number_ = iVar7;
        uVar3 = this->_has_bits_[0] | 2;
        this->_has_bits_[0] = uVar3;
        if ((puVar4 < puVar6) && (*puVar4 == '\x1a')) {
          input->buffer_ = puVar4 + 1;
          goto LAB_001ea7d6;
        }
      }
      goto LAB_001ea663;
    }
LAB_001ea766:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumValueDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_number;
        break;
      }

      // optional int32 number = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}